

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O1

string * SettingToString(string *__return_storage_ptr__,SettingsValue *value,string *strDefault)

{
  long in_FS_OFFSET;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_48;
  bool local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  SettingToString_abi_cxx11_
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_48,value);
  std::optional<std::__cxx11::string>::value_or<std::__cxx11::string_const&>
            (__return_storage_ptr__,(optional<std::__cxx11::string> *)&local_48,strDefault);
  if (local_28 == true) {
    local_28 = false;
    if (local_48._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_48._M_value + 0x10)) {
      operator_delete((void *)local_48._M_value._M_dataplus._M_p,local_48._16_8_ + 1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string SettingToString(const common::SettingsValue& value, const std::string& strDefault)
{
    return SettingToString(value).value_or(strDefault);
}